

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlParserInputBufferPush(xmlParserInputBufferPtr in,int len,char *buf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlBufPtr pxVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (len < 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = -1;
    if ((in != (xmlParserInputBufferPtr)0x0) && (in->error == 0)) {
      if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        iVar2 = xmlBufAdd(in->buffer,(xmlChar *)buf,len);
        iVar3 = len;
        if (iVar2 != 0) {
          return -1;
        }
      }
      else {
        if (in->raw == (xmlBufPtr)0x0) {
          pxVar4 = xmlBufCreate();
          in->raw = pxVar4;
        }
        iVar2 = xmlBufAdd(in->raw,(xmlChar *)buf,len);
        iVar3 = 0;
        bVar1 = false;
        if (iVar2 == 0) {
          sVar5 = xmlBufUse(in->raw);
          iVar3 = xmlCharEncInput(in,1);
          if (iVar3 < 0) {
            bVar1 = false;
            __xmlSimpleError(8,0x608,(xmlNodePtr)0x0,"encoder error",(char *)0x0);
            in->error = 0x608;
          }
          else {
            sVar6 = xmlBufUse(in->raw);
            in->rawconsumed = in->rawconsumed + ((sVar5 & 0xffffffff) - sVar6);
            bVar1 = true;
          }
        }
        if (!bVar1) {
          return -1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlParserInputBufferPush(xmlParserInputBufferPtr in,
	                 int len, const char *buf) {
    int nbchars = 0;
    int ret;

    if (len < 0) return(0);
    if ((in == NULL) || (in->error)) return(-1);
    if (in->encoder != NULL) {
        unsigned int use;

        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate();
	}
	ret = xmlBufAdd(in->raw, (const xmlChar *) buf, len);
	if (ret != 0)
	    return(-1);

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
	use = xmlBufUse(in->raw);
	nbchars = xmlCharEncInput(in, 1);
	if (nbchars < 0) {
	    xmlIOErr(XML_IO_ENCODER, NULL);
	    in->error = XML_IO_ENCODER;
	    return(-1);
	}
	in->rawconsumed += (use - xmlBufUse(in->raw));
    } else {
	nbchars = len;
        ret = xmlBufAdd(in->buffer, (xmlChar *) buf, nbchars);
	if (ret != 0)
	    return(-1);
    }
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: pushed %d chars, buffer %d/%d\n",
            nbchars, xmlBufUse(in->buffer), xmlBufLength(in->buffer));
#endif
    return(nbchars);
}